

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  Session *pSVar1;
  Config *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__function;
  Session *this_00;
  unique_ptr<Catch::ColourImpl> colour;
  unique_ptr<Catch::IStream> errStream;
  InternalParseResult result;
  ColourImpl *local_e0;
  IStream *local_d8;
  ColourGuard local_d0;
  undefined1 local_c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 local_88 [64];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  ostream *stream;
  
  iVar3 = 1;
  if (this->m_startupExceptions == false) {
    Clara::Args::Args((Args *)local_c0,argc,argv);
    Clara::Detail::ParserBase::parse
              ((InternalParseResult *)local_88,(ParserBase *)this,(Args *)local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    pSVar1 = (Session *)(local_c0 + 0x10);
    this_00 = (Session *)local_c0._0_8_;
    if ((Session *)local_c0._0_8_ != pSVar1) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    if (local_88._8_4_ == Ok) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      pCVar2 = (this->m_config).m_ptr;
      if (pCVar2 != (Config *)0x0) {
        (*(pCVar2->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar3 = 0;
    }
    else {
      config(this);
      if (Context::currentContext == (undefined8 *)0x0) {
        Context::currentContext = (undefined8 *)operator_new(0x10);
        *Context::currentContext = 0;
        Context::currentContext[1] = 0;
      }
      *Context::currentContext = (this->m_config).m_ptr;
      local_c0._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"%stderr","");
      makeStream((Catch *)&local_d8,(string *)local_c0);
      if ((Session *)local_c0._0_8_ != pSVar1) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      makeColourImpl((Catch *)&local_e0,PlatformDefault,local_d8);
      if (local_d8 == (IStream *)0x0) {
        __function = 
        "T *Catch::Detail::unique_ptr<Catch::IStream>::operator->() [T = Catch::IStream]";
LAB_00126190:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                      ,0x385,__function);
      }
      iVar3 = (*local_d8->_vptr_IStream[2])(local_d8);
      stream = (ostream *)CONCAT44(extraout_var,iVar3);
      if (local_e0 == (ColourImpl *)0x0) {
        __function = 
        "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]";
        goto LAB_00126190;
      }
      local_d0.m_colourImpl = local_e0;
      local_d0.m_code = Red;
      local_d0.m_engaged = false;
      ColourImpl::ColourGuard::engageImpl(&local_d0,stream);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\nError(s) in input:\n",0x14);
      local_c0._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,local_48._M_p,local_48._M_p + local_40);
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4f;
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      TextFlow::operator<<(stream,(Column *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n\n",2);
      if ((Session *)local_c0._0_8_ != pSVar1) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      if (local_d0.m_engaged == true) {
        (*(local_d0.m_colourImpl)->_vptr_ColourImpl[2])(local_d0.m_colourImpl,0);
      }
      iVar3 = (*local_d8->_vptr_IStream[2])(local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)CONCAT44(extraout_var_00,iVar3),"Run with -? for usage\n\n",0x17);
      std::ostream::flush();
      (*local_e0->_vptr_ColourImpl[1])(local_e0);
      (*local_d8->_vptr_IStream[1])(local_d8);
      iVar3 = 0xff;
    }
    local_88._0_8_ = &PTR__BasicResult_00246ec8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    local_88._0_8_ = &PTR__ResultValueBase_00246f20;
    if (local_88._8_4_ == Ok) {
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
              (local_88 + 0x28));
    }
  }
  return iVar3;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }